

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

int pospopcnt_u16_avx512bw_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t i;
  long lVar3;
  ulong uVar4;
  long lVar5;
  uint16_t *puVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [64];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  uint16_t tmp [32];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined1 local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 local_280 [64];
  uint local_240;
  undefined1 auStack_23c [60];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  uVar7 = 0;
  memset(local_680,0,0x400);
  local_280._0_4_ = len >> 9;
  if (0xfffff < len) {
    local_240 = len;
    puVar6 = array + 0x1e0;
    uVar7 = 0;
    auVar10 = vpbroadcastb_avx512bw(ZEXT116(0x55));
    auVar11 = vpbroadcastb_avx512bw(ZEXT116(0x33));
    do {
      auVar12 = vmovdqa64_avx512f(local_540);
      auVar13 = vmovdqa64_avx512f(local_500);
      auVar14 = vmovdqa64_avx512f(local_4c0);
      auVar15 = vmovdqa64_avx512f(local_480);
      auVar16 = vmovdqa64_avx512f(local_440);
      auVar17 = vmovdqa64_avx512f(local_400);
      auVar18 = vmovdqa64_avx512f(local_3c0);
      auVar19 = vmovdqa64_avx512f(local_380);
      auVar20 = vmovdqa64_avx512f(local_340);
      auVar21 = vmovdqa64_avx512f(local_300);
      auVar22 = vmovdqa64_avx512f(local_2c0);
      lVar3 = 0;
      do {
        local_180 = local_600;
        local_140 = local_640;
        local_200 = local_580;
        local_1c0 = local_5c0;
        auVar23 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x3c0));
        auVar24 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x380));
        auVar25 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x340));
        auVar26 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x300));
        auVar27 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x2c0));
        auVar28 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x280));
        auVar29 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x240));
        auVar30 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x200));
        auVar31 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x1c0));
        auVar32 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x180));
        auVar33 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x140));
        auVar34 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x100));
        auVar35 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0xc0));
        auVar36 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x80));
        auVar37 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3 + -0x40));
        auVar38 = vmovdqu64_avx512f(*(undefined1 (*) [64])((long)puVar6 + lVar3));
        auVar39 = vpandq_avx512f(auVar23,auVar10);
        auVar40 = vpandq_avx512f(auVar24,auVar10);
        auVar39 = vpaddb_avx512bw(auVar40,auVar39);
        auVar23 = vpsrlw_avx512bw(auVar23,1);
        auVar24 = vpsrlw_avx512bw(auVar24,1);
        auVar23 = vpandq_avx512f(auVar23,auVar10);
        auVar24 = vpandq_avx512f(auVar24,auVar10);
        auVar23 = vpaddb_avx512bw(auVar24,auVar23);
        auVar24 = vpandq_avx512f(auVar25,auVar10);
        auVar40 = vpandq_avx512f(auVar26,auVar10);
        auVar24 = vpaddb_avx512bw(auVar40,auVar24);
        auVar25 = vpsrlw_avx512bw(auVar25,1);
        auVar26 = vpsrlw_avx512bw(auVar26,1);
        auVar25 = vpandq_avx512f(auVar25,auVar10);
        auVar26 = vpandq_avx512f(auVar26,auVar10);
        auVar25 = vpaddb_avx512bw(auVar26,auVar25);
        auVar26 = vpandq_avx512f(auVar27,auVar10);
        auVar40 = vpandq_avx512f(auVar28,auVar10);
        auVar26 = vpaddb_avx512bw(auVar40,auVar26);
        auVar27 = vpsrlw_avx512bw(auVar27,1);
        auVar28 = vpsrlw_avx512bw(auVar28,1);
        auVar27 = vpandq_avx512f(auVar27,auVar10);
        auVar28 = vpandq_avx512f(auVar28,auVar10);
        auVar27 = vpaddb_avx512bw(auVar28,auVar27);
        auVar28 = vpandq_avx512f(auVar29,auVar10);
        auVar40 = vpandq_avx512f(auVar30,auVar10);
        auVar28 = vpaddb_avx512bw(auVar40,auVar28);
        auVar29 = vpsrlw_avx512bw(auVar29,1);
        auVar30 = vpsrlw_avx512bw(auVar30,1);
        auVar29 = vpandq_avx512f(auVar29,auVar10);
        auVar30 = vpandq_avx512f(auVar30,auVar10);
        auVar29 = vpaddb_avx512bw(auVar30,auVar29);
        auVar30 = vpandq_avx512f(auVar31,auVar10);
        auVar40 = vpandq_avx512f(auVar32,auVar10);
        auVar30 = vpaddb_avx512bw(auVar40,auVar30);
        auVar31 = vpsrlw_avx512bw(auVar31,1);
        auVar32 = vpsrlw_avx512bw(auVar32,1);
        auVar31 = vpandq_avx512f(auVar31,auVar10);
        auVar32 = vpandq_avx512f(auVar32,auVar10);
        auVar31 = vpaddb_avx512bw(auVar32,auVar31);
        auVar32 = vpandq_avx512f(auVar33,auVar10);
        auVar40 = vpandq_avx512f(auVar34,auVar10);
        auVar32 = vpaddb_avx512bw(auVar40,auVar32);
        auVar33 = vpsrlw_avx512bw(auVar33,1);
        auVar34 = vpsrlw_avx512bw(auVar34,1);
        auVar33 = vpandq_avx512f(auVar33,auVar10);
        auVar34 = vpandq_avx512f(auVar34,auVar10);
        auVar33 = vpaddb_avx512bw(auVar34,auVar33);
        auVar34 = vpandq_avx512f(auVar35,auVar10);
        auVar40 = vpandq_avx512f(auVar36,auVar10);
        auVar34 = vpaddb_avx512bw(auVar40,auVar34);
        auVar35 = vpsrlw_avx512bw(auVar35,1);
        auVar36 = vpsrlw_avx512bw(auVar36,1);
        auVar35 = vpandq_avx512f(auVar35,auVar10);
        auVar36 = vpandq_avx512f(auVar36,auVar10);
        auVar35 = vpaddb_avx512bw(auVar36,auVar35);
        auVar36 = vpandq_avx512f(auVar37,auVar10);
        auVar40 = vpandq_avx512f(auVar38,auVar10);
        auVar36 = vpaddb_avx512bw(auVar40,auVar36);
        auVar37 = vpsrlw_avx512bw(auVar37,1);
        auVar38 = vpsrlw_avx512bw(auVar38,1);
        auVar37 = vpandq_avx512f(auVar37,auVar10);
        auVar10 = vpandq_avx512f(auVar38,auVar10);
        auVar10 = vpaddb_avx512bw(auVar10,auVar37);
        auVar37 = vpandq_avx512f(auVar39,auVar11);
        auVar38 = vpandq_avx512f(auVar24,auVar11);
        auVar37 = vpaddb_avx512bw(auVar38,auVar37);
        auVar38 = vpsrlw_avx512bw(auVar39,2);
        auVar24 = vpsrlw_avx512bw(auVar24,2);
        auVar38 = vpandq_avx512f(auVar38,auVar11);
        auVar24 = vpandq_avx512f(auVar24,auVar11);
        auVar24 = vpaddb_avx512bw(auVar24,auVar38);
        auVar38 = vpandq_avx512f(auVar26,auVar11);
        auVar39 = vpandq_avx512f(auVar28,auVar11);
        auVar38 = vpaddb_avx512bw(auVar39,auVar38);
        auVar26 = vpsrlw_avx512bw(auVar26,2);
        auVar28 = vpsrlw_avx512bw(auVar28,2);
        auVar26 = vpandq_avx512f(auVar26,auVar11);
        auVar28 = vpandq_avx512f(auVar28,auVar11);
        auVar26 = vpaddb_avx512bw(auVar28,auVar26);
        auVar28 = vpandq_avx512f(auVar30,auVar11);
        auVar39 = vpandq_avx512f(auVar32,auVar11);
        auVar28 = vpaddb_avx512bw(auVar39,auVar28);
        auVar30 = vpsrlw_avx512bw(auVar30,2);
        auVar32 = vpsrlw_avx512bw(auVar32,2);
        auVar30 = vpandq_avx512f(auVar30,auVar11);
        auVar32 = vpandq_avx512f(auVar32,auVar11);
        auVar30 = vpaddb_avx512bw(auVar32,auVar30);
        auVar32 = vpandq_avx512f(auVar34,auVar11);
        auVar39 = vpandq_avx512f(auVar36,auVar11);
        auVar32 = vpaddb_avx512bw(auVar39,auVar32);
        auVar34 = vpsrlw_avx512bw(auVar34,2);
        auVar36 = vpsrlw_avx512bw(auVar36,2);
        auVar34 = vpandq_avx512f(auVar34,auVar11);
        auVar36 = vpandq_avx512f(auVar36,auVar11);
        auVar34 = vpaddb_avx512bw(auVar36,auVar34);
        auVar36 = vpandq_avx512f(auVar23,auVar11);
        auVar39 = vpandq_avx512f(auVar25,auVar11);
        auVar36 = vpaddb_avx512bw(auVar39,auVar36);
        auVar23 = vpsrlw_avx512bw(auVar23,2);
        auVar25 = vpsrlw_avx512bw(auVar25,2);
        auVar23 = vpandq_avx512f(auVar23,auVar11);
        auVar25 = vpandq_avx512f(auVar25,auVar11);
        auVar23 = vpaddb_avx512bw(auVar25,auVar23);
        auVar25 = vpandq_avx512f(auVar27,auVar11);
        auVar11 = vpandq_avx512f(auVar29,auVar11);
        auVar11 = vpaddb_avx512bw(auVar11,auVar25);
        auVar25 = vpsrlw_avx512bw(auVar27,2);
        auVar27 = vpsrlw_avx512bw(auVar29,2);
        auVar29 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar25 = vpandq_avx512f(auVar25,auVar29);
        auVar29 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar27 = vpandq_avx512f(auVar27,auVar29);
        auVar25 = vpaddb_avx512bw(auVar27,auVar25);
        auVar27 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar27 = vpandq_avx512f(auVar31,auVar27);
        auVar29 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar29 = vpandq_avx512f(auVar33,auVar29);
        auVar27 = vpaddb_avx512bw(auVar29,auVar27);
        auVar29 = vpsrlw_avx512bw(auVar31,2);
        auVar31 = vpsrlw_avx512bw(auVar33,2);
        auVar33 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar29 = vpandq_avx512f(auVar29,auVar33);
        auVar33 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar31 = vpandq_avx512f(auVar31,auVar33);
        auVar29 = vpaddb_avx512bw(auVar31,auVar29);
        auVar31 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar31 = vpandq_avx512f(auVar35,auVar31);
        auVar33 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar33 = vpandq_avx512f(auVar10,auVar33);
        auVar31 = vpaddb_avx512bw(auVar33,auVar31);
        auVar33 = vpsrlw_avx512bw(auVar35,2);
        auVar10 = vpsrlw_avx512bw(auVar10,2);
        auVar35 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar33 = vpandq_avx512f(auVar33,auVar35);
        auVar35 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar10 = vpandq_avx512f(auVar10,auVar35);
        auVar10 = vpaddb_avx512bw(auVar10,auVar33);
        auVar33 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar33 = vpandq_avx512f(auVar37,auVar33);
        auVar35 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar35 = vpandq_avx512f(auVar38,auVar35);
        auVar33 = vpaddb_avx512bw(auVar35,auVar33);
        auVar35 = vpsrlw_avx512bw(auVar37,4);
        auVar37 = vpbroadcastb_avx512bw(ZEXT116(7));
        auVar38 = vpsrlw_avx512bw(auVar38,4);
        auVar35 = vpandq_avx512f(auVar35,auVar37);
        auVar38 = vpandq_avx512f(auVar38,auVar37);
        auVar35 = vpaddb_avx512bw(auVar38,auVar35);
        auVar38 = vpandq_avx512f(auVar28,auVar37);
        auVar39 = vpandq_avx512f(auVar32,auVar37);
        auVar38 = vpaddb_avx512bw(auVar39,auVar38);
        auVar28 = vpsrlw_avx512bw(auVar28,4);
        auVar32 = vpsrlw_avx512bw(auVar32,4);
        auVar28 = vpandq_avx512f(auVar28,auVar37);
        auVar32 = vpandq_avx512f(auVar32,auVar37);
        auVar28 = vpaddb_avx512bw(auVar32,auVar28);
        auVar32 = vpandq_avx512f(auVar36,auVar37);
        auVar39 = vpandq_avx512f(auVar11,auVar37);
        auVar32 = vpaddb_avx512bw(auVar39,auVar32);
        auVar36 = vpsrlw_avx512bw(auVar36,4);
        auVar11 = vpsrlw_avx512bw(auVar11,4);
        auVar36 = vpandq_avx512f(auVar36,auVar37);
        auVar11 = vpandq_avx512f(auVar11,auVar37);
        auVar36 = vpaddb_avx512bw(auVar11,auVar36);
        auVar11 = vpandq_avx512f(auVar27,auVar37);
        auVar39 = vpandq_avx512f(auVar31,auVar37);
        auVar11 = vpaddb_avx512bw(auVar39,auVar11);
        auVar27 = vpsrlw_avx512bw(auVar27,4);
        auVar31 = vpsrlw_avx512bw(auVar31,4);
        auVar27 = vpandq_avx512f(auVar27,auVar37);
        auVar31 = vpandq_avx512f(auVar31,auVar37);
        auVar27 = vpaddb_avx512bw(auVar31,auVar27);
        auVar31 = vpandq_avx512f(auVar24,auVar37);
        auVar39 = vpandq_avx512f(auVar26,auVar37);
        auVar31 = vpaddb_avx512bw(auVar39,auVar31);
        auVar24 = vpsrlw_avx512bw(auVar24,4);
        auVar26 = vpsrlw_avx512bw(auVar26,4);
        auVar24 = vpandq_avx512f(auVar24,auVar37);
        auVar26 = vpandq_avx512f(auVar26,auVar37);
        auVar24 = vpaddb_avx512bw(auVar26,auVar24);
        auVar26 = vpandq_avx512f(auVar30,auVar37);
        auVar39 = vpandq_avx512f(auVar34,auVar37);
        auVar26 = vpaddb_avx512bw(auVar39,auVar26);
        auVar30 = vpsrlw_avx512bw(auVar30,4);
        auVar34 = vpsrlw_avx512bw(auVar34,4);
        auVar30 = vpandq_avx512f(auVar30,auVar37);
        auVar34 = vpandq_avx512f(auVar34,auVar37);
        auVar30 = vpaddb_avx512bw(auVar34,auVar30);
        auVar34 = vpandq_avx512f(auVar23,auVar37);
        auVar39 = vpandq_avx512f(auVar25,auVar37);
        auVar34 = vpaddb_avx512bw(auVar39,auVar34);
        auVar23 = vpsrlw_avx512bw(auVar23,4);
        auVar25 = vpsrlw_avx512bw(auVar25,4);
        auVar23 = vpandq_avx512f(auVar23,auVar37);
        auVar25 = vpandq_avx512f(auVar25,auVar37);
        auVar23 = vpaddb_avx512bw(auVar25,auVar23);
        auVar25 = vpandq_avx512f(auVar29,auVar37);
        auVar39 = vpandq_avx512f(auVar10,auVar37);
        auVar25 = vpaddb_avx512bw(auVar39,auVar25);
        auVar29 = vpsrlw_avx512bw(auVar29,4);
        auVar10 = vpsrlw_avx512bw(auVar10,4);
        auVar29 = vpandq_avx512f(auVar29,auVar37);
        auVar10 = vpandq_avx512f(auVar10,auVar37);
        auVar37 = vpbroadcastw_avx512bw(ZEXT216(0xf));
        auVar29 = vpaddb_avx512bw(auVar10,auVar29);
        auVar10 = vpandq_avx512f(auVar33,auVar37);
        auVar39 = vpandq_avx512f(auVar38,auVar37);
        auVar10 = vpaddb_avx512bw(auVar39,auVar10);
        auVar39 = vmovdqa64_avx512f(local_680);
        local_680 = vpaddw_avx512bw(auVar39,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar33,8);
        auVar33 = vmovdqa64_avx512f(local_180);
        auVar38 = vpsrlw_avx512bw(auVar38,8);
        auVar10 = vpaddb_avx512bw(auVar38,auVar10);
        auVar15 = vpaddw_avx512bw(auVar15,auVar10);
        auVar10 = vpandq_avx512f(auVar32,auVar37);
        auVar38 = vpandq_avx512f(auVar11,auVar37);
        auVar10 = vpaddb_avx512bw(auVar38,auVar10);
        auVar38 = vmovdqa64_avx512f(local_140);
        local_640 = vpaddw_avx512bw(auVar38,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar32,8);
        auVar32 = vpsrlw_avx512bw(auVar11,8);
        auVar11 = vpbroadcastb_avx512bw(ZEXT116(0x33));
        auVar10 = vpaddb_avx512bw(auVar32,auVar10);
        auVar16 = vpaddw_avx512bw(auVar16,auVar10);
        auVar10 = vpandq_avx512f(auVar31,auVar37);
        auVar32 = vpandq_avx512f(auVar26,auVar37);
        auVar10 = vpaddb_avx512bw(auVar32,auVar10);
        local_600 = vpaddw_avx512bw(auVar33,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar31,8);
        auVar31 = vmovdqa64_avx512f(local_1c0);
        auVar26 = vpsrlw_avx512bw(auVar26,8);
        auVar10 = vpaddb_avx512bw(auVar26,auVar10);
        auVar17 = vpaddw_avx512bw(auVar17,auVar10);
        auVar10 = vpandq_avx512f(auVar34,auVar37);
        auVar26 = vpandq_avx512f(auVar25,auVar37);
        auVar10 = vpaddb_avx512bw(auVar26,auVar10);
        local_5c0 = vpaddw_avx512bw(auVar31,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar34,8);
        auVar26 = vmovdqa64_avx512f(local_200);
        auVar25 = vpsrlw_avx512bw(auVar25,8);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        auVar18 = vpaddw_avx512bw(auVar18,auVar10);
        auVar10 = vpandq_avx512f(auVar35,auVar37);
        auVar25 = vpandq_avx512f(auVar28,auVar37);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        local_580 = vpaddw_avx512bw(auVar26,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar35,8);
        auVar25 = vpsrlw_avx512bw(auVar28,8);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        auVar19 = vpaddw_avx512bw(auVar19,auVar10);
        auVar10 = vpandq_avx512f(auVar36,auVar37);
        auVar25 = vpandq_avx512f(auVar27,auVar37);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        auVar12 = vpaddw_avx512bw(auVar12,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar36,8);
        auVar25 = vpsrlw_avx512bw(auVar27,8);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        auVar20 = vpaddw_avx512bw(auVar20,auVar10);
        auVar10 = vpandq_avx512f(auVar24,auVar37);
        auVar25 = vpandq_avx512f(auVar30,auVar37);
        auVar10 = vpaddb_avx512bw(auVar25,auVar10);
        auVar13 = vpaddw_avx512bw(auVar13,auVar10);
        auVar10 = vpsrlw_avx512bw(auVar24,8);
        auVar24 = vpsrlw_avx512bw(auVar30,8);
        auVar10 = vpaddb_avx512bw(auVar24,auVar10);
        auVar21 = vpaddw_avx512bw(auVar21,auVar10);
        auVar10 = vpandq_avx512f(auVar23,auVar37);
        auVar24 = vpandq_avx512f(auVar29,auVar37);
        auVar24 = vpaddb_avx512bw(auVar24,auVar10);
        auVar10 = vpbroadcastb_avx512bw(ZEXT116(0x55));
        auVar14 = vpaddw_avx512bw(auVar14,auVar24);
        auVar23 = vpsrlw_avx512bw(auVar23,8);
        auVar24 = vpsrlw_avx512bw(auVar29,8);
        auVar23 = vpaddb_avx512bw(auVar24,auVar23);
        auVar22 = vpaddw_avx512bw(auVar22,auVar23);
        lVar3 = lVar3 + 0x400;
      } while (lVar3 != 0x200000);
      local_680 = vmovdqa64_avx512f(local_680);
      local_640 = vmovdqa64_avx512f(local_640);
      local_600 = vmovdqa64_avx512f(local_600);
      local_5c0 = vmovdqa64_avx512f(local_5c0);
      local_580 = vmovdqa64_avx512f(local_580);
      local_540 = vmovdqa64_avx512f(auVar12);
      local_500 = vmovdqa64_avx512f(auVar13);
      local_4c0 = vmovdqa64_avx512f(auVar14);
      local_480 = vmovdqa64_avx512f(auVar15);
      local_440 = vmovdqa64_avx512f(auVar16);
      local_400 = vmovdqa64_avx512f(auVar17);
      local_3c0 = vmovdqa64_avx512f(auVar18);
      local_380 = vmovdqa64_avx512f(auVar19);
      local_340 = vmovdqa64_avx512f(auVar20);
      local_300 = vmovdqa64_avx512f(auVar21);
      local_2c0 = vmovdqa64_avx512f(auVar22);
      lVar3 = 0;
      do {
        lVar5 = lVar3 * 0x40;
        local_100 = *(undefined8 *)(local_680 + lVar5);
        uStack_f8 = *(undefined8 *)(local_680 + lVar5 + 8);
        uStack_f0 = *(undefined8 *)(local_680 + lVar5 + 0x10);
        uStack_e8 = *(undefined8 *)(local_680 + lVar5 + 0x18);
        uStack_e0 = *(undefined8 *)(local_680 + lVar5 + 0x20);
        uStack_d8 = *(undefined8 *)(local_640 + lVar5 + -0x18);
        uStack_d0 = *(undefined8 *)(local_640 + lVar5 + -0x10);
        uStack_c8 = *(undefined8 *)(local_640 + lVar5 + -8);
        auVar10 = ZEXT464(flags[lVar3]);
        lVar5 = 0;
        do {
          auVar11 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)&local_100 + lVar5 * 2));
          auVar10 = vpaddd_avx512f(auVar10,auVar11);
          lVar5 = lVar5 + 0x10;
        } while (lVar5 != 0x20);
        auVar9 = vextracti64x4_avx512f(auVar10,1);
        auVar10 = vpaddd_avx512f(auVar10,ZEXT3264(auVar9));
        auVar1 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
        auVar2 = vpshufd_avx(auVar1,0xee);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        auVar2 = vpshufd_avx(auVar1,0x55);
        auVar1 = vpaddd_avx(auVar1,auVar2);
        flags[lVar3] = auVar1._0_4_;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
      memset(local_680,0,0x400);
      uVar7 = uVar7 + 1;
      puVar6 = puVar6 + 0x100000;
      auVar10 = vpbroadcastb_avx512bw(ZEXT116(0x55));
      auVar11 = vpbroadcastb_avx512bw(ZEXT116(0x33));
    } while (uVar7 != len >> 0x14);
    uVar7 = uVar7 * 0x800;
    len = local_240;
  }
  uVar4 = (ulong)(uint)local_280._0_4_;
  lVar3 = uVar4 - uVar7;
  if (uVar7 <= uVar4 && lVar3 != 0) {
    auVar10 = vmovdqa64_avx512f(local_680);
    auVar11 = vmovdqa64_avx512f(local_640);
    auVar12 = vmovdqa64_avx512f(local_600);
    auVar13 = vmovdqa64_avx512f(local_5c0);
    auVar14 = vmovdqa64_avx512f(local_580);
    auVar15 = vmovdqa64_avx512f(local_540);
    auVar16 = vmovdqa64_avx512f(local_500);
    auVar17 = vmovdqa64_avx512f(local_4c0);
    auVar18 = vmovdqa64_avx512f(local_480);
    auVar19 = vmovdqa64_avx512f(local_440);
    auVar20 = vmovdqa64_avx512f(local_400);
    auVar21 = vmovdqa64_avx512f(local_3c0);
    auVar22 = vmovdqa64_avx512f(local_380);
    auVar23 = vmovdqa64_avx512f(local_340);
    auVar24 = vmovdqa64_avx512f(local_300);
    auVar25 = vmovdqa64_avx512f(local_2c0);
    pauVar8 = (undefined1 (*) [64])(array + uVar7 * 0x200 + 0x1e0);
    auVar26 = vpbroadcastb_avx512bw(ZEXT116(0x55));
    auVar27 = vpbroadcastb_avx512bw(ZEXT116(0x33));
    auVar28 = vpbroadcastb_avx512bw(ZEXT116(7));
    auVar29 = vpbroadcastw_avx512bw(ZEXT216(0xf));
    do {
      auVar18 = vmovdqa64_avx512f(auVar18);
      local_280 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar21);
      auVar21 = vmovdqa64_avx512f(auVar22);
      auVar22 = vmovdqa64_avx512f(auVar23);
      auVar23 = vmovdqa64_avx512f(auVar24);
      auVar25 = vmovdqa64_avx512f(auVar25);
      auVar24 = vmovdqu64_avx512f(pauVar8[-0xf]);
      auVar30 = vmovdqu64_avx512f(pauVar8[-0xe]);
      auVar31 = vmovdqu64_avx512f(pauVar8[-0xd]);
      auVar32 = vmovdqu64_avx512f(pauVar8[-0xc]);
      auVar33 = vmovdqu64_avx512f(pauVar8[-0xb]);
      auVar34 = vmovdqu64_avx512f(pauVar8[-10]);
      auVar35 = vmovdqu64_avx512f(pauVar8[-9]);
      auVar36 = vmovdqu64_avx512f(pauVar8[-8]);
      auVar37 = vmovdqu64_avx512f(pauVar8[-7]);
      auVar38 = vmovdqu64_avx512f(pauVar8[-6]);
      auVar39 = vmovdqu64_avx512f(pauVar8[-5]);
      auVar40 = vmovdqu64_avx512f(pauVar8[-4]);
      auVar41 = vmovdqu64_avx512f(pauVar8[-3]);
      auVar42 = vmovdqu64_avx512f(pauVar8[-2]);
      auVar43 = vmovdqu64_avx512f(pauVar8[-1]);
      auVar44 = vmovdqu64_avx512f(*pauVar8);
      auVar45 = vpandq_avx512f(auVar24,auVar26);
      auVar46 = vpandq_avx512f(auVar30,auVar26);
      auVar45 = vpaddb_avx512bw(auVar46,auVar45);
      auVar24 = vpsrlw_avx512bw(auVar24,1);
      auVar30 = vpsrlw_avx512bw(auVar30,1);
      auVar24 = vpandq_avx512f(auVar24,auVar26);
      auVar30 = vpandq_avx512f(auVar30,auVar26);
      auVar24 = vpaddb_avx512bw(auVar30,auVar24);
      auVar30 = vpandq_avx512f(auVar31,auVar26);
      auVar46 = vpandq_avx512f(auVar32,auVar26);
      auVar30 = vpaddb_avx512bw(auVar46,auVar30);
      auVar31 = vpsrlw_avx512bw(auVar31,1);
      auVar32 = vpsrlw_avx512bw(auVar32,1);
      auVar31 = vpandq_avx512f(auVar31,auVar26);
      auVar32 = vpandq_avx512f(auVar32,auVar26);
      auVar31 = vpaddb_avx512bw(auVar32,auVar31);
      auVar32 = vpandq_avx512f(auVar33,auVar26);
      auVar46 = vpandq_avx512f(auVar34,auVar26);
      auVar32 = vpaddb_avx512bw(auVar46,auVar32);
      auVar33 = vpsrlw_avx512bw(auVar33,1);
      auVar34 = vpsrlw_avx512bw(auVar34,1);
      auVar33 = vpandq_avx512f(auVar33,auVar26);
      auVar34 = vpandq_avx512f(auVar34,auVar26);
      auVar33 = vpaddb_avx512bw(auVar34,auVar33);
      auVar34 = vpandq_avx512f(auVar35,auVar26);
      auVar46 = vpandq_avx512f(auVar36,auVar26);
      auVar34 = vpaddb_avx512bw(auVar46,auVar34);
      auVar35 = vpsrlw_avx512bw(auVar35,1);
      auVar36 = vpsrlw_avx512bw(auVar36,1);
      auVar35 = vpandq_avx512f(auVar35,auVar26);
      auVar36 = vpandq_avx512f(auVar36,auVar26);
      auVar35 = vpaddb_avx512bw(auVar36,auVar35);
      auVar36 = vpandq_avx512f(auVar37,auVar26);
      auVar46 = vpandq_avx512f(auVar38,auVar26);
      auVar36 = vpaddb_avx512bw(auVar46,auVar36);
      auVar37 = vpsrlw_avx512bw(auVar37,1);
      auVar38 = vpsrlw_avx512bw(auVar38,1);
      auVar37 = vpandq_avx512f(auVar37,auVar26);
      auVar38 = vpandq_avx512f(auVar38,auVar26);
      auVar37 = vpaddb_avx512bw(auVar38,auVar37);
      auVar38 = vpandq_avx512f(auVar39,auVar26);
      auVar46 = vpandq_avx512f(auVar40,auVar26);
      auVar38 = vpaddb_avx512bw(auVar46,auVar38);
      auVar39 = vpsrlw_avx512bw(auVar39,1);
      auVar40 = vpsrlw_avx512bw(auVar40,1);
      auVar39 = vpandq_avx512f(auVar39,auVar26);
      auVar40 = vpandq_avx512f(auVar40,auVar26);
      auVar39 = vpaddb_avx512bw(auVar40,auVar39);
      auVar40 = vpandq_avx512f(auVar41,auVar26);
      auVar46 = vpandq_avx512f(auVar42,auVar26);
      auVar40 = vpaddb_avx512bw(auVar46,auVar40);
      auVar41 = vpsrlw_avx512bw(auVar41,1);
      auVar42 = vpsrlw_avx512bw(auVar42,1);
      auVar41 = vpandq_avx512f(auVar41,auVar26);
      auVar42 = vpandq_avx512f(auVar42,auVar26);
      auVar41 = vpaddb_avx512bw(auVar42,auVar41);
      auVar42 = vpandq_avx512f(auVar43,auVar26);
      auVar46 = vpandq_avx512f(auVar44,auVar26);
      auVar42 = vpaddb_avx512bw(auVar46,auVar42);
      auVar43 = vpsrlw_avx512bw(auVar43,1);
      auVar44 = vpsrlw_avx512bw(auVar44,1);
      auVar43 = vpandq_avx512f(auVar43,auVar26);
      auVar44 = vpandq_avx512f(auVar44,auVar26);
      auVar43 = vpaddb_avx512bw(auVar44,auVar43);
      auVar44 = vpandq_avx512f(auVar45,auVar27);
      auVar46 = vpandq_avx512f(auVar30,auVar27);
      auVar44 = vpaddb_avx512bw(auVar46,auVar44);
      auVar45 = vpsrlw_avx512bw(auVar45,2);
      auVar30 = vpsrlw_avx512bw(auVar30,2);
      auVar45 = vpandq_avx512f(auVar45,auVar27);
      auVar30 = vpandq_avx512f(auVar30,auVar27);
      auVar30 = vpaddb_avx512bw(auVar30,auVar45);
      auVar45 = vpandq_avx512f(auVar32,auVar27);
      auVar46 = vpandq_avx512f(auVar34,auVar27);
      auVar45 = vpaddb_avx512bw(auVar46,auVar45);
      auVar32 = vpsrlw_avx512bw(auVar32,2);
      auVar34 = vpsrlw_avx512bw(auVar34,2);
      auVar32 = vpandq_avx512f(auVar32,auVar27);
      auVar34 = vpandq_avx512f(auVar34,auVar27);
      auVar32 = vpaddb_avx512bw(auVar34,auVar32);
      auVar34 = vpandq_avx512f(auVar36,auVar27);
      auVar46 = vpandq_avx512f(auVar38,auVar27);
      auVar34 = vpaddb_avx512bw(auVar46,auVar34);
      auVar36 = vpsrlw_avx512bw(auVar36,2);
      auVar38 = vpsrlw_avx512bw(auVar38,2);
      auVar36 = vpandq_avx512f(auVar36,auVar27);
      auVar38 = vpandq_avx512f(auVar38,auVar27);
      auVar36 = vpaddb_avx512bw(auVar38,auVar36);
      auVar38 = vpandq_avx512f(auVar40,auVar27);
      auVar46 = vpandq_avx512f(auVar42,auVar27);
      auVar38 = vpaddb_avx512bw(auVar46,auVar38);
      auVar40 = vpsrlw_avx512bw(auVar40,2);
      auVar42 = vpsrlw_avx512bw(auVar42,2);
      auVar40 = vpandq_avx512f(auVar40,auVar27);
      auVar42 = vpandq_avx512f(auVar42,auVar27);
      auVar40 = vpaddb_avx512bw(auVar42,auVar40);
      auVar42 = vpandq_avx512f(auVar24,auVar27);
      auVar46 = vpandq_avx512f(auVar31,auVar27);
      auVar42 = vpaddb_avx512bw(auVar46,auVar42);
      auVar24 = vpsrlw_avx512bw(auVar24,2);
      auVar31 = vpsrlw_avx512bw(auVar31,2);
      auVar24 = vpandq_avx512f(auVar24,auVar27);
      auVar31 = vpandq_avx512f(auVar31,auVar27);
      auVar24 = vpaddb_avx512bw(auVar31,auVar24);
      auVar31 = vpandq_avx512f(auVar33,auVar27);
      auVar46 = vpandq_avx512f(auVar35,auVar27);
      auVar31 = vpaddb_avx512bw(auVar46,auVar31);
      auVar33 = vpsrlw_avx512bw(auVar33,2);
      auVar35 = vpsrlw_avx512bw(auVar35,2);
      auVar33 = vpandq_avx512f(auVar33,auVar27);
      auVar35 = vpandq_avx512f(auVar35,auVar27);
      auVar33 = vpaddb_avx512bw(auVar35,auVar33);
      auVar35 = vpandq_avx512f(auVar37,auVar27);
      auVar46 = vpandq_avx512f(auVar39,auVar27);
      auVar35 = vpaddb_avx512bw(auVar46,auVar35);
      auVar37 = vpsrlw_avx512bw(auVar37,2);
      auVar39 = vpsrlw_avx512bw(auVar39,2);
      auVar37 = vpandq_avx512f(auVar37,auVar27);
      auVar39 = vpandq_avx512f(auVar39,auVar27);
      auVar37 = vpaddb_avx512bw(auVar39,auVar37);
      auVar39 = vpandq_avx512f(auVar41,auVar27);
      auVar46 = vpandq_avx512f(auVar43,auVar27);
      auVar39 = vpaddb_avx512bw(auVar46,auVar39);
      auVar41 = vpsrlw_avx512bw(auVar41,2);
      auVar43 = vpsrlw_avx512bw(auVar43,2);
      auVar41 = vpandq_avx512f(auVar41,auVar27);
      auVar43 = vpandq_avx512f(auVar43,auVar27);
      auVar41 = vpaddb_avx512bw(auVar43,auVar41);
      auVar43 = vpandq_avx512f(auVar44,auVar28);
      auVar46 = vpandq_avx512f(auVar45,auVar28);
      auVar43 = vpaddb_avx512bw(auVar46,auVar43);
      auVar44 = vpsrlw_avx512bw(auVar44,4);
      auVar45 = vpsrlw_avx512bw(auVar45,4);
      auVar44 = vpandq_avx512f(auVar44,auVar28);
      auVar45 = vpandq_avx512f(auVar45,auVar28);
      auVar44 = vpaddb_avx512bw(auVar45,auVar44);
      auVar45 = vpandq_avx512f(auVar34,auVar28);
      auVar46 = vpandq_avx512f(auVar38,auVar28);
      auVar45 = vpaddb_avx512bw(auVar46,auVar45);
      auVar34 = vpsrlw_avx512bw(auVar34,4);
      auVar38 = vpsrlw_avx512bw(auVar38,4);
      auVar34 = vpandq_avx512f(auVar34,auVar28);
      auVar38 = vpandq_avx512f(auVar38,auVar28);
      auVar34 = vpaddb_avx512bw(auVar38,auVar34);
      auVar38 = vpandq_avx512f(auVar42,auVar28);
      auVar46 = vpandq_avx512f(auVar31,auVar28);
      auVar38 = vpaddb_avx512bw(auVar46,auVar38);
      auVar42 = vpsrlw_avx512bw(auVar42,4);
      auVar31 = vpsrlw_avx512bw(auVar31,4);
      auVar42 = vpandq_avx512f(auVar42,auVar28);
      auVar31 = vpandq_avx512f(auVar31,auVar28);
      auVar31 = vpaddb_avx512bw(auVar31,auVar42);
      auVar42 = vpandq_avx512f(auVar35,auVar28);
      auVar46 = vpandq_avx512f(auVar39,auVar28);
      auVar42 = vpaddb_avx512bw(auVar46,auVar42);
      auVar35 = vpsrlw_avx512bw(auVar35,4);
      auVar39 = vpsrlw_avx512bw(auVar39,4);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar35 = vpandq_avx512f(auVar35,auVar28);
      auVar39 = vpandq_avx512f(auVar39,auVar28);
      auVar35 = vpaddb_avx512bw(auVar39,auVar35);
      auVar39 = vpandq_avx512f(auVar30,auVar28);
      auVar46 = vpandq_avx512f(auVar32,auVar28);
      auVar39 = vpaddb_avx512bw(auVar46,auVar39);
      auVar30 = vpsrlw_avx512bw(auVar30,4);
      auVar32 = vpsrlw_avx512bw(auVar32,4);
      auVar30 = vpandq_avx512f(auVar30,auVar28);
      auVar32 = vpandq_avx512f(auVar32,auVar28);
      auVar30 = vpaddb_avx512bw(auVar32,auVar30);
      auVar32 = vpandq_avx512f(auVar36,auVar28);
      auVar46 = vpandq_avx512f(auVar40,auVar28);
      auVar32 = vpaddb_avx512bw(auVar46,auVar32);
      auVar36 = vpsrlw_avx512bw(auVar36,4);
      auVar40 = vpsrlw_avx512bw(auVar40,4);
      auVar36 = vpandq_avx512f(auVar36,auVar28);
      auVar40 = vpandq_avx512f(auVar40,auVar28);
      auVar36 = vpaddb_avx512bw(auVar40,auVar36);
      auVar40 = vpandq_avx512f(auVar24,auVar28);
      auVar46 = vpandq_avx512f(auVar33,auVar28);
      auVar40 = vpaddb_avx512bw(auVar46,auVar40);
      auVar24 = vpsrlw_avx512bw(auVar24,4);
      auVar33 = vpsrlw_avx512bw(auVar33,4);
      auVar24 = vpandq_avx512f(auVar24,auVar28);
      auVar33 = vpandq_avx512f(auVar33,auVar28);
      auVar33 = vpaddb_avx512bw(auVar33,auVar24);
      auVar24 = vpandq_avx512f(auVar37,auVar28);
      auVar46 = vpandq_avx512f(auVar41,auVar28);
      auVar24 = vpaddb_avx512bw(auVar46,auVar24);
      auVar37 = vpsrlw_avx512bw(auVar37,4);
      auVar41 = vpsrlw_avx512bw(auVar41,4);
      auVar37 = vpandq_avx512f(auVar37,auVar28);
      auVar41 = vpandq_avx512f(auVar41,auVar28);
      auVar37 = vpaddb_avx512bw(auVar41,auVar37);
      auVar41 = vpandq_avx512f(auVar43,auVar29);
      auVar46 = vpandq_avx512f(auVar45,auVar29);
      auVar41 = vpaddb_avx512bw(auVar46,auVar41);
      auVar46 = vmovdqa64_avx512f(local_280);
      auVar10 = vpaddw_avx512bw(auVar10,auVar41);
      auVar41 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar43,8);
      auVar43 = vpsrlw_avx512bw(auVar45,8);
      auVar19 = vpaddb_avx512bw(auVar43,auVar19);
      auVar18 = vpaddw_avx512bw(auVar18,auVar19);
      auVar19 = vpandq_avx512f(auVar38,auVar29);
      auVar43 = vpandq_avx512f(auVar42,auVar29);
      auVar19 = vpaddb_avx512bw(auVar43,auVar19);
      auVar11 = vpaddw_avx512bw(auVar11,auVar19);
      auVar19 = vpsrlw_avx512bw(auVar38,8);
      auVar38 = vmovdqa64_avx512f(auVar22);
      auVar22 = vpsrlw_avx512bw(auVar42,8);
      auVar42 = vmovdqa64_avx512f(auVar23);
      auVar19 = vpaddb_avx512bw(auVar22,auVar19);
      auVar19 = vpaddw_avx512bw(auVar46,auVar19);
      auVar22 = vpandq_avx512f(auVar39,auVar29);
      auVar23 = vpandq_avx512f(auVar32,auVar29);
      auVar22 = vpaddb_avx512bw(auVar23,auVar22);
      auVar12 = vpaddw_avx512bw(auVar12,auVar22);
      auVar22 = vpsrlw_avx512bw(auVar39,8);
      auVar23 = vmovdqa64_avx512f(auVar21);
      auVar21 = vpsrlw_avx512bw(auVar32,8);
      auVar32 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpaddb_avx512bw(auVar21,auVar22);
      auVar20 = vpaddw_avx512bw(auVar41,auVar20);
      auVar21 = vpandq_avx512f(auVar40,auVar29);
      auVar22 = vpandq_avx512f(auVar24,auVar29);
      auVar21 = vpaddb_avx512bw(auVar22,auVar21);
      auVar13 = vpaddw_avx512bw(auVar13,auVar21);
      auVar21 = vpsrlw_avx512bw(auVar40,8);
      auVar22 = vpsrlw_avx512bw(auVar24,8);
      auVar21 = vpaddb_avx512bw(auVar22,auVar21);
      auVar21 = vpaddw_avx512bw(auVar32,auVar21);
      auVar22 = vpandq_avx512f(auVar44,auVar29);
      auVar24 = vpandq_avx512f(auVar34,auVar29);
      auVar22 = vpaddb_avx512bw(auVar24,auVar22);
      auVar14 = vpaddw_avx512bw(auVar14,auVar22);
      auVar22 = vpsrlw_avx512bw(auVar44,8);
      auVar24 = vpsrlw_avx512bw(auVar34,8);
      auVar22 = vpaddb_avx512bw(auVar24,auVar22);
      auVar22 = vpaddw_avx512bw(auVar23,auVar22);
      auVar23 = vpandq_avx512f(auVar31,auVar29);
      auVar24 = vpandq_avx512f(auVar35,auVar29);
      auVar23 = vpaddb_avx512bw(auVar24,auVar23);
      auVar15 = vpaddw_avx512bw(auVar15,auVar23);
      auVar23 = vpsrlw_avx512bw(auVar31,8);
      auVar24 = vpsrlw_avx512bw(auVar35,8);
      auVar23 = vpaddb_avx512bw(auVar24,auVar23);
      auVar23 = vpaddw_avx512bw(auVar38,auVar23);
      auVar24 = vpandq_avx512f(auVar30,auVar29);
      auVar31 = vpandq_avx512f(auVar36,auVar29);
      auVar24 = vpaddb_avx512bw(auVar31,auVar24);
      auVar16 = vpaddw_avx512bw(auVar16,auVar24);
      auVar24 = vpsrlw_avx512bw(auVar30,8);
      auVar30 = vpsrlw_avx512bw(auVar36,8);
      auVar24 = vpaddb_avx512bw(auVar30,auVar24);
      auVar24 = vpaddw_avx512bw(auVar42,auVar24);
      auVar30 = vpandq_avx512f(auVar33,auVar29);
      auVar31 = vpandq_avx512f(auVar37,auVar29);
      auVar30 = vpaddb_avx512bw(auVar31,auVar30);
      auVar17 = vpaddw_avx512bw(auVar17,auVar30);
      auVar30 = vpsrlw_avx512bw(auVar33,8);
      auVar31 = vpsrlw_avx512bw(auVar37,8);
      auVar30 = vpaddb_avx512bw(auVar31,auVar30);
      auVar25 = vmovdqa64_avx512f(auVar25);
      auVar25 = vpaddw_avx512bw(auVar25,auVar30);
      auVar25 = vmovdqa64_avx512f(auVar25);
      auVar25 = vmovdqa64_avx512f(auVar25);
      pauVar8 = pauVar8 + 0x10;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    local_680 = vmovdqa64_avx512f(auVar10);
    local_640 = vmovdqa64_avx512f(auVar11);
    local_600 = vmovdqa64_avx512f(auVar12);
    local_5c0 = vmovdqa64_avx512f(auVar13);
    local_580 = vmovdqa64_avx512f(auVar14);
    local_540 = vmovdqa64_avx512f(auVar15);
    local_500 = vmovdqa64_avx512f(auVar16);
    local_4c0 = vmovdqa64_avx512f(auVar17);
    local_480 = vmovdqa64_avx512f(auVar18);
    local_440 = vmovdqa64_avx512f(auVar19);
    local_400 = vmovdqa64_avx512f(auVar20);
    local_3c0 = vmovdqa64_avx512f(auVar21);
    local_380 = vmovdqa64_avx512f(auVar22);
    local_340 = vmovdqa64_avx512f(auVar23);
    local_300 = vmovdqa64_avx512f(auVar24);
    local_2c0 = vmovdqa64_avx512f(auVar25);
    uVar7 = uVar4;
  }
  uVar7 = uVar7 << 9;
  if (uVar7 < len) {
    auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])flags);
    auVar11 = vpmovsxbd_avx512f(_DAT_0011a080);
    auVar12 = vpbroadcastd_avx512f(ZEXT416(1));
    do {
      auVar13 = vpbroadcastd_avx512f();
      auVar13 = vpsrlvd_avx512f(auVar13,auVar11);
      auVar13 = vpandd_avx512f(auVar13,auVar12);
      auVar10 = vpaddd_avx512f(auVar13,auVar10);
      uVar7 = uVar7 + 1;
    } while (len != uVar7);
    auVar10 = vmovdqu64_avx512f(auVar10);
    *(undefined1 (*) [64])flags = auVar10;
  }
  lVar3 = 0;
  do {
    lVar5 = lVar3 * 0x40;
    local_100 = *(undefined8 *)(local_680 + lVar5);
    uStack_f8 = *(undefined8 *)(local_680 + lVar5 + 8);
    uStack_f0 = *(undefined8 *)(local_680 + lVar5 + 0x10);
    uStack_e8 = *(undefined8 *)(local_680 + lVar5 + 0x18);
    uStack_e0 = *(undefined8 *)(local_680 + lVar5 + 0x20);
    uStack_d8 = *(undefined8 *)(local_640 + lVar5 + -0x18);
    uStack_d0 = *(undefined8 *)(local_640 + lVar5 + -0x10);
    uStack_c8 = *(undefined8 *)(local_640 + lVar5 + -8);
    auVar10 = ZEXT464(flags[lVar3]);
    lVar5 = 0;
    do {
      auVar11 = vpmovzxwd_avx512f(*(undefined1 (*) [32])((long)&local_100 + lVar5 * 2));
      auVar10 = vpaddd_avx512f(auVar10,auVar11);
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x20);
    auVar9 = vextracti64x4_avx512f(auVar10,1);
    auVar10 = vpaddd_avx512f(auVar10,ZEXT3264(auVar9));
    auVar1 = vpaddd_avx(auVar10._0_16_,auVar10._16_16_);
    auVar2 = vpshufd_avx(auVar1,0xee);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    auVar2 = vpshufd_avx(auVar1,0x55);
    auVar1 = vpaddd_avx(auVar1,auVar2);
    flags[lVar3] = auVar1._0_4_;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x10);
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m512i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm512_setzero_si512();
    }

    const __m512i mask1bit = _mm512_set1_epi16(0x5555); // 0101010101010101 Pattern: 01
    const __m512i mask2bit = _mm512_set1_epi16(0x3333); // 0011001100110011 Pattern: 0011
    const __m512i mask4bit = _mm512_set1_epi16(0x0F0F); // 0000111100001111 Pattern: 00001111
    const __m512i mask8bit = _mm512_set1_epi16(0x00FF); // 0000000011111111 Pattern: 0000000011111111
    
    const uint32_t n_cycles = len / (2048 * (16*32));
    const uint32_t n_total  = len / (16*32);
    uint16_t tmp[32];

/*------ Macros --------*/
#define LE(i,p,k)  const __m512i sum##p##k##_##i##bit_even = _mm512_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m512i sum##p##k##_##i##bit_odd  = _mm512_add_epi8(_mm512_srli_epi16(input##p, i) & mask##i##bit, _mm512_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)           \
    LE(i,0,1)   LO(i,0,1)   \
    LE(i,2,3)   LO(i,2,3)   \
    LE(i,4,5)   LO(i,4,5)   \
    LE(i,6,7)   LO(i,6,7)   \
    LE(i,8,9)   LO(i,8,9)   \
    LE(i,10,11) LO(i,10,11) \
    LE(i,12,13) LO(i,12,13) \
    LE(i,14,15) LO(i,14,15) \

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*2048*512 + j*512 + p*32));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 2048; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)tmp, counters[i]);
            for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm512_setzero_si512();
        }
    }
#undef L
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*512 + p*32));
    i *= 2048;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 512;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LE
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm512_storeu_si512((__m512i*)tmp, counters[i]);
        for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
    }
    return 0;
}